

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_nurbssurface.cpp
# Opt level: O3

ON_3dVector * __thiscall
ON_HermiteSurface::TwistAt(ON_3dVector *__return_storage_ptr__,ON_HermiteSurface *this,int u,int v)

{
  ON_3dVector *pOVar1;
  double dVar2;
  
  __return_storage_ptr__->z = ON_3dVector::UnsetVector.z;
  dVar2 = ON_3dVector::UnsetVector.y;
  __return_storage_ptr__->x = ON_3dVector::UnsetVector.x;
  __return_storage_ptr__->y = dVar2;
  if ((((-1 < u) && (-1 < v)) && (u < this->m_u_count)) && (v < this->m_v_count)) {
    pOVar1 = (this->m_twists).m_a[(uint)u].m_a;
    __return_storage_ptr__->z = pOVar1[(uint)v].z;
    pOVar1 = pOVar1 + (uint)v;
    dVar2 = pOVar1->y;
    __return_storage_ptr__->x = pOVar1->x;
    __return_storage_ptr__->y = dVar2;
  }
  return __return_storage_ptr__;
}

Assistant:

ON_3dVector ON_HermiteSurface::TwistAt(int u, int v) const
{
  ON_3dVector rc = ON_3dVector::UnsetVector;
  if (InBounds(u, v))
    rc = m_twists[u][v];
  return rc;
}